

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindowlayout_p.cpp
# Opt level: O3

void * __thiscall QMainWindowLayout::qt_metacast(QMainWindowLayout *this,char *_clname)

{
  int iVar1;
  void *pvVar2;
  
  if (_clname == (char *)0x0) {
    this = (QMainWindowLayout *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN17QMainWindowLayoutE_t>
                           .strings);
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"QMainWindowLayoutSeparatorHelper<QMainWindowLayout>");
      if (iVar1 != 0) {
        pvVar2 = QLayout::qt_metacast((QLayout *)this,_clname);
        return pvVar2;
      }
      this = this + 0x20;
    }
  }
  return this;
}

Assistant:

void *QMainWindowLayout::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_ZN17QMainWindowLayoutE_t>.strings))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "QMainWindowLayoutSeparatorHelper<QMainWindowLayout>"))
        return static_cast< QMainWindowLayoutSeparatorHelper<QMainWindowLayout>*>(this);
    return QLayout::qt_metacast(_clname);
}